

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_meta.cpp
# Opt level: O2

MppMetaImpl * __thiscall MppMetaService::get_meta(MppMetaService *this,char *tag,char *caller)

{
  RK_U32 *pRVar1;
  RK_U32 RVar2;
  list_head *plVar3;
  MppMetaImpl *__dest;
  long lVar4;
  char *pcVar5;
  list_head *plVar6;
  
  __dest = (MppMetaImpl *)mpp_osal_malloc("get_meta",0x318);
  if (__dest == (MppMetaImpl *)0x0) {
    _mpp_log_l(2,"mpp_meta","failed to malloc meta data\n","get_meta");
  }
  else {
    pcVar5 = "mpp_meta";
    if (tag != (char *)0x0) {
      pcVar5 = tag;
    }
    strncpy((char *)__dest,pcVar5,0x1f);
    __dest->caller = caller;
    LOCK();
    pRVar1 = &this->meta_id;
    RVar2 = *pRVar1;
    *pRVar1 = *pRVar1 + 1;
    UNLOCK();
    __dest->meta_id = RVar2;
    plVar6 = &__dest->list_meta;
    (__dest->list_meta).next = plVar6;
    (__dest->list_meta).prev = plVar6;
    __dest->ref_count = 1;
    __dest->node_count = 0;
    for (lVar4 = 0x48; lVar4 != 0x318; lVar4 = lVar4 + 0x10) {
      pcVar5 = __dest->tag + lVar4;
      pcVar5[0] = '\0';
      pcVar5[1] = '\0';
      pcVar5[2] = '\0';
      pcVar5[3] = '\0';
    }
    mpp_spinlock_lock(&this->mLock);
    plVar3 = (this->mlist_meta).prev;
    (this->mlist_meta).prev = plVar6;
    (__dest->list_meta).next = &this->mlist_meta;
    (__dest->list_meta).prev = plVar3;
    plVar3->next = plVar6;
    mpp_spinlock_unlock(&this->mLock);
    LOCK();
    this->meta_count = this->meta_count + 1;
    UNLOCK();
  }
  return __dest;
}

Assistant:

MppMetaImpl *MppMetaService::get_meta(const char *tag, const char *caller)
{
    MppMetaImpl *impl = mpp_malloc_size(MppMetaImpl, sizeof(MppMetaImpl) +
                                        sizeof(MppMetaVal) * MPP_ARRAY_ELEMS(meta_defs));
    if (impl) {
        const char *tag_src = (tag) ? (tag) : (MODULE_TAG);
        RK_U32 i;

        strncpy(impl->tag, tag_src, sizeof(impl->tag) - 1);
        impl->caller = caller;
        impl->meta_id = MPP_FETCH_ADD(&meta_id, 1);
        INIT_LIST_HEAD(&impl->list_meta);
        impl->ref_count = 1;
        impl->node_count = 0;

        for (i = 0; i < MPP_ARRAY_ELEMS(meta_defs); i++)
            impl->vals[i].state = 0;

        mpp_spinlock_lock(&mLock);
        list_add_tail(&impl->list_meta, &mlist_meta);
        mpp_spinlock_unlock(&mLock);
        MPP_FETCH_ADD(&meta_count, 1);
    } else {
        mpp_err_f("failed to malloc meta data\n");
    }
    return impl;
}